

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pager_write_changecounter(PgHdr *pPg)

{
  u32 uVar1;
  uint uVar2;
  
  if (pPg != (PgHdr *)0x0) {
    uVar1 = sqlite3Get4byte((u8 *)pPg->pPager->dbFileVers);
    uVar2 = uVar1 + 1;
    uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 * 0x1000000;
    *(uint *)((long)pPg->pData + 0x18) = uVar2;
    *(uint *)((long)pPg->pData + 0x5c) = uVar2;
    *(undefined4 *)((long)pPg->pData + 0x60) = 0x632e00;
  }
  return;
}

Assistant:

static void pager_write_changecounter(PgHdr *pPg){
  u32 change_counter;
  if( NEVER(pPg==0) ) return;

  /* Increment the value just read and write it back to byte 24. */
  change_counter = sqlite3Get4byte((u8*)pPg->pPager->dbFileVers)+1;
  put32bits(((char*)pPg->pData)+24, change_counter);

  /* Also store the SQLite version number in bytes 96..99 and in
  ** bytes 92..95 store the change counter for which the version number
  ** is valid. */
  put32bits(((char*)pPg->pData)+92, change_counter);
  put32bits(((char*)pPg->pData)+96, SQLITE_VERSION_NUMBER);
}